

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFParser::parse(QPDFParser *this,InputSource *input,string *object_description,QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  Tokenizer tokenizer;
  undefined1 local_179;
  undefined1 local_178 [168];
  QPDFParser local_d0;
  
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)(local_178 + 0x10));
  iVar1 = (*input->_vptr_InputSource[3])(input);
  make_description((QPDFParser *)local_178,(string *)CONCAT44(extraout_var,iVar1),object_description
                  );
  local_d0.decrypter = (StringDecrypter *)0x0;
  local_d0.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_178._0_8_;
  local_d0.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
  local_d0.parse_pdf = false;
  local_d0.stream_id = 0;
  local_d0.obj_id = 0;
  local_d0.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.frame = (StackFrame *)0x0;
  local_d0.bad_count = 0;
  local_d0.max_bad_count = 0xf;
  local_d0.good_count = 0;
  local_d0.start = 0;
  local_d0.int_count = 0;
  local_178._0_8_ = (InputSource *)0x0;
  local_178._8_8_ = (string *)0x0;
  local_d0.int_buffer[0] = 0;
  local_d0.int_buffer[1] = 0;
  local_d0.last_offset_buffer[0] = 0;
  local_d0.last_offset_buffer[1] = 0;
  local_d0.input = input;
  local_d0.object_description = object_description;
  local_d0.tokenizer = (Tokenizer *)(local_178 + 0x10);
  local_d0.context = context;
  parse(this,(bool *)&local_d0,SUB81(&local_179,0));
  ~QPDFParser(&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
  ::qpdf::Tokenizer::~Tokenizer((Tokenizer *)(local_178 + 0x10));
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(InputSource& input, std::string const& object_description, QPDF* context)
{
    qpdf::Tokenizer tokenizer;
    bool empty = false;
    return QPDFParser(
               input,
               make_description(input.getName(), object_description),
               object_description,
               tokenizer,
               nullptr,
               context,
               false)
        .parse(empty, false);
}